

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv32_impl.h
# Opt level: O3

void secp256k1_modinv32_var(secp256k1_modinv32_signed30 *x,secp256k1_modinv32_modinfo *modinfo)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  secp256k1_modinv32_trans2x2 t;
  secp256k1_modinv32_signed30 g;
  secp256k1_modinv32_signed30 f;
  secp256k1_modinv32_signed30 d;
  secp256k1_modinv32_trans2x2 local_f8;
  secp256k1_modinv32_signed30 *local_e8;
  undefined8 local_e0;
  secp256k1_modinv32_signed30 local_d8;
  int iStack_ac;
  secp256k1_modinv32_signed30 local_a8;
  secp256k1_modinv32_signed30 local_78;
  secp256k1_modinv32_signed30 local_54;
  
  local_78.v[4] = 0;
  local_78.v[5] = 0;
  local_78.v[6] = 0;
  local_78.v[7] = 0;
  local_78.v[0] = 0;
  local_78.v[1] = 0;
  local_78.v[2] = 0;
  local_78.v[3] = 0;
  local_78.v[8] = 0;
  local_54.v[5] = 0;
  local_54.v[6] = 0;
  local_54.v[7] = 0;
  local_54.v[8] = 0;
  local_54.v[1] = 0;
  local_54.v[2] = 0;
  local_54.v[3] = 0;
  local_54.v[4] = 0;
  local_54.v[0] = 1;
  local_a8.v[8] = (modinfo->modulus).v[8];
  local_a8.v._0_8_ = *(undefined8 *)(modinfo->modulus).v;
  local_a8.v._8_8_ = *(undefined8 *)((modinfo->modulus).v + 2);
  local_a8.v._16_8_ = *(undefined8 *)((modinfo->modulus).v + 4);
  local_a8.v._24_8_ = *(undefined8 *)((modinfo->modulus).v + 6);
  local_d8.v[8] = x->v[8];
  local_d8.v._0_8_ = *(undefined8 *)x->v;
  local_d8.v._8_8_ = *(undefined8 *)(x->v + 2);
  local_d8.v._16_8_ = *(undefined8 *)(x->v + 4);
  local_d8.v._24_8_ = *(undefined8 *)(x->v + 6);
  uVar8 = 9;
  iVar11 = -1;
  local_e8 = x;
  do {
    iVar5 = 0;
    if ((local_d8.v[0] | 0xc0000000U) != 0) {
      for (; ((local_d8.v[0] | 0xc0000000U) >> iVar5 & 1) == 0; iVar5 = iVar5 + 1) {
      }
    }
    iVar11 = iVar11 - iVar5;
    if (iVar5 == 0x1e) {
      local_f8.u = 0x40000000;
      local_f8.q = 0;
      local_f8.r = 1;
      local_f8.v = 0;
    }
    else {
      local_f8.r = 1;
      local_f8.u = 1 << ((byte)iVar5 & 0x1f);
      uVar10 = (uint)local_d8.v[0] >> ((byte)iVar5 & 0x1f);
      iVar5 = 0x1e - iVar5;
      local_f8.v = 0;
      local_f8.q = 0;
      uVar6 = local_a8.v[0];
      do {
        iVar12 = local_f8.r;
        if (iVar11 < 0) {
          iVar11 = -iVar11;
          uVar2 = -uVar6;
          iVar12 = -local_f8.u;
          uVar6 = uVar10;
          uVar10 = uVar2;
          local_f8.u = local_f8.q;
          local_f8.q = iVar12;
          iVar12 = -local_f8.v;
          local_f8.v = local_f8.r;
        }
        iVar1 = iVar11 + 1;
        if (iVar5 <= iVar11 + 1) {
          iVar1 = iVar5;
        }
        uVar2 = ((uint)(byte)(secp256k1_modinv32_inv256[uVar6 >> 1 & 0x7f] * (char)uVar10) <<
                (-(char)iVar1 & 0x1fU)) >> (-(char)iVar1 & 0x1fU);
        uVar10 = uVar2 * uVar6 + uVar10;
        local_f8.q = uVar2 * local_f8.u + local_f8.q;
        local_f8.r = uVar2 * local_f8.v + iVar12;
        uVar2 = -1 << ((byte)iVar5 & 0x1f) | uVar10;
        iVar12 = 0;
        if (uVar2 != 0) {
          for (; (uVar2 >> iVar12 & 1) == 0; iVar12 = iVar12 + 1) {
          }
        }
        bVar4 = (byte)iVar12;
        uVar10 = uVar10 >> (bVar4 & 0x1f);
        local_f8.u = local_f8.u << (bVar4 & 0x1f);
        local_f8.v = local_f8.v << (bVar4 & 0x1f);
        iVar11 = iVar11 - iVar12;
        iVar5 = iVar5 - iVar12;
      } while (iVar5 != 0);
    }
    local_e0 = uVar8;
    secp256k1_modinv32_update_de_30(&local_78,&local_54,&local_f8,modinfo);
    uVar8 = local_e0;
    iVar5 = (int)local_e0;
    secp256k1_modinv32_update_fg_30_var(iVar5,&local_a8,&local_d8,&local_f8);
    lVar3 = (long)iVar5;
    if (local_d8.v[0] == 0) {
      if (iVar5 < 2) {
LAB_00160907:
        secp256k1_modinv32_normalize_30(&local_78,(&iStack_ac)[lVar3],modinfo);
        local_e8->v[8] = local_78.v[8];
        *(undefined8 *)(local_e8->v + 4) = local_78.v._16_8_;
        *(undefined8 *)(local_e8->v + 6) = local_78.v._24_8_;
        *(undefined8 *)local_e8->v = local_78.v._0_8_;
        *(undefined8 *)(local_e8->v + 2) = local_78.v._8_8_;
        return;
      }
      uVar6 = 0;
      uVar9 = 1;
      do {
        uVar6 = uVar6 | local_d8.v[uVar9];
        uVar9 = uVar9 + 1;
      } while ((uVar8 & 0xffffffff) != uVar9);
      if (uVar6 == 0) goto LAB_00160907;
    }
    iVar12 = (&iStack_ac)[lVar3];
    iVar1 = *(int *)((long)&local_e0 + lVar3 * 4 + 4);
    iVar7 = iVar5 + -2;
    if (iVar1 >> 0x1f == iVar1 && (iVar12 >> 0x1f == iVar12 && -1 < iVar7)) {
      uVar8 = (ulong)(iVar5 - 1);
      local_a8.v[iVar7] = local_a8.v[iVar7] | iVar12 << 0x1e;
      local_d8.v[iVar7] = local_d8.v[iVar7] | iVar1 << 0x1e;
    }
  } while( true );
}

Assistant:

static void secp256k1_modinv32_var(secp256k1_modinv32_signed30 *x, const secp256k1_modinv32_modinfo *modinfo) {
    /* Start with d=0, e=1, f=modulus, g=x, eta=-1. */
    secp256k1_modinv32_signed30 d = {{0, 0, 0, 0, 0, 0, 0, 0, 0}};
    secp256k1_modinv32_signed30 e = {{1, 0, 0, 0, 0, 0, 0, 0, 0}};
    secp256k1_modinv32_signed30 f = modinfo->modulus;
    secp256k1_modinv32_signed30 g = *x;
#ifdef VERIFY
    int i = 0;
#endif
    int j, len = 9;
    int32_t eta = -1; /* eta = -delta; delta is initially 1 (faster for the variable-time code) */
    int32_t cond, fn, gn;

    /* Do iterations of 30 divsteps each until g=0. */
    while (1) {
        /* Compute transition matrix and new eta after 30 divsteps. */
        secp256k1_modinv32_trans2x2 t;
        eta = secp256k1_modinv32_divsteps_30_var(eta, f.v[0], g.v[0], &t);
        /* Update d,e using that transition matrix. */
        secp256k1_modinv32_update_de_30(&d, &e, &t, modinfo);
        /* Update f,g using that transition matrix. */

        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, -1) > 0); /* f > -modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, -1) > 0); /* g > -modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, 1) < 0);  /* g <  modulus */

        secp256k1_modinv32_update_fg_30_var(len, &f, &g, &t);
        /* If the bottom limb of g is 0, there is a chance g=0. */
        if (g.v[0] == 0) {
            cond = 0;
            /* Check if all other limbs are also 0. */
            for (j = 1; j < len; ++j) {
                cond |= g.v[j];
            }
            /* If so, we're done. */
            if (cond == 0) break;
        }

        /* Determine if len>1 and limb (len-1) of both f and g is 0 or -1. */
        fn = f.v[len - 1];
        gn = g.v[len - 1];
        cond = ((int32_t)len - 2) >> 31;
        cond |= fn ^ (fn >> 31);
        cond |= gn ^ (gn >> 31);
        /* If so, reduce length, propagating the sign of f and g's top limb into the one below. */
        if (cond == 0) {
            f.v[len - 2] |= (uint32_t)fn << 30;
            g.v[len - 2] |= (uint32_t)gn << 30;
            --len;
        }

        VERIFY_CHECK(++i < 25); /* We should never need more than 25*30 = 750 divsteps */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, -1) > 0); /* f > -modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, -1) > 0); /* g > -modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, 1) < 0);  /* g <  modulus */
    }

    /* At this point g is 0 and (if g was not originally 0) f must now equal +/- GCD of
     * the initial f, g values i.e. +/- 1, and d now contains +/- the modular inverse. */

    /* g == 0 */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &SECP256K1_SIGNED30_ONE, 0) == 0);
    /* |f| == 1, or (x == 0 and d == 0 and |f|=modulus) */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &SECP256K1_SIGNED30_ONE, -1) == 0 ||
                 secp256k1_modinv32_mul_cmp_30(&f, len, &SECP256K1_SIGNED30_ONE, 1) == 0 ||
                 (secp256k1_modinv32_mul_cmp_30(x, 9, &SECP256K1_SIGNED30_ONE, 0) == 0 &&
                  secp256k1_modinv32_mul_cmp_30(&d, 9, &SECP256K1_SIGNED30_ONE, 0) == 0 &&
                  (secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, 1) == 0 ||
                   secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, -1) == 0)));

    /* Optionally negate d, normalize to [0,modulus), and return it. */
    secp256k1_modinv32_normalize_30(&d, f.v[len - 1], modinfo);
    *x = d;
}